

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void __thiscall soul::StructuralParser::parseStructDeclaration(StructuralParser *this)

{
  SourceCodeText *o;
  DestructorFn *pDVar1;
  Scope *pSVar2;
  ModuleBase *pMVar3;
  bool bVar4;
  Identifier IVar5;
  PoolItem *pPVar6;
  Expression *type;
  Context local_48;
  
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pDVar1 = (DestructorFn *)(this->super_SOULTokeniser).location.location.data;
  pSVar2 = this->currentScope;
  IVar5 = parseIdentifier(this);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27e598);
  pPVar6 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x2e0);
  *(undefined4 *)&pPVar6->field_0x18 = 0x21;
  pPVar6[1].size = (size_t)o;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pPVar6[1].destructor = pDVar1;
  pPVar6[1].item = pSVar2;
  *(undefined4 *)&pPVar6[1].field_0x18 = 1;
  pPVar6[2].size = (size_t)IVar5.name;
  pPVar6->item = &PTR__StructDeclaration_002f72f8;
  pPVar6[2].destructor = (DestructorFn *)0x0;
  pPVar6[2].item = &pPVar6[3].destructor;
  *(undefined8 *)&pPVar6[2].field_0x18 = 0;
  pPVar6[3].size = 0x10;
  *(undefined1 *)&pPVar6[0x17].destructor = 0;
  pPVar6->destructor =
       PoolAllocator::
       allocate<soul::AST::StructDeclaration,_soul::AST::Context_&,_soul::Identifier_&>::
       anon_class_1_0_00000001::__invoke;
  pMVar3 = (this->module).object;
  if (pMVar3 != (ModuleBase *)0x0) {
    local_48.location.sourceCode.object = (SourceCodeText *)&pPVar6->item;
    std::
    vector<soul::pool_ref<soul::AST::StructDeclaration>,std::allocator<soul::pool_ref<soul::AST::StructDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::AST::StructDeclaration>>
              ((vector<soul::pool_ref<soul::AST::StructDeclaration>,std::allocator<soul::pool_ref<soul::AST::StructDeclaration>>>
                *)&pMVar3->structures,(pool_ref<soul::AST::StructDeclaration> *)&local_48);
    while( true ) {
      bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27cf28);
      if (bVar4) break;
      type = parseType(this,structMember);
      do {
        local_48.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object
        ;
        if (local_48.location.sourceCode.object != (SourceCodeText *)0x0) {
          ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount =
               ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
        }
        local_48.location.location.data = (this->super_SOULTokeniser).location.location.data;
        local_48.parentScope = this->currentScope;
        IVar5 = parseIdentifier(this);
        AST::StructDeclaration::addMember((StructDeclaration *)&pPVar6->item,type,&local_48,IVar5);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.location.sourceCode.object);
        bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27e596);
      } while (bVar4);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27ca5c);
    }
    giveErrorOnSemicolon(this);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
    return;
  }
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

void parseStructDeclaration()
    {
        auto context = getContext();
        auto name = parseIdentifier();
        expect (Operator::openBrace);

        auto& newStruct = allocate<AST::StructDeclaration> (context, name);
        module->structures.push_back (newStruct);

        while (! matchIf (Operator::closeBrace))
        {
            auto& type = parseType (ParseTypeContext::structMember);

            for (;;)
            {
                newStruct.addMember (type, getContext(), parseIdentifier());

                if (matchIf (Operator::comma))
                    continue;

                expect (Operator::semicolon);
                break;
            }
        }

        giveErrorOnSemicolon();
    }